

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O1

void __thiscall logger::OutputWorker::Flush(OutputWorker *this)

{
  unique_lock<std::mutex> locker;
  unique_lock<std::mutex> local_20;
  
  local_20._M_device = &this->QueueLock;
  local_20._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_20);
  local_20._M_owns = true;
  if (((this->Terminated)._M_base._M_i & 1U) == 0) {
    LOCK();
    (this->FlushRequested)._M_base._M_i = true;
    UNLOCK();
    std::condition_variable::notify_all();
    std::condition_variable::wait((unique_lock *)&this->FlushCondition);
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_20);
  return;
}

Assistant:

void OutputWorker::Flush()
{
    // unique_lock used since FlushCondition.wait requires it
    std::unique_lock<std::mutex> locker(QueueLock);

    if (!Terminated)
    {
        FlushRequested = true;
        QueueCondition.notify_all();

        FlushCondition.wait(locker);
    }
}